

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# launcher.cxx
# Opt level: O2

int __thiscall
nuraft::raft_launcher::init
          (raft_launcher *this,ptr<state_machine> *sm,ptr<state_mgr> *smgr,ptr<logger> *lg,
          int port_number,options *asio_options,raft_params *params_given,init_options *opt)

{
  __shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  context *this_01;
  undefined4 in_register_00000084;
  ptr<delayed_task_scheduler> scheduler;
  ptr<rpc_client_factory> rpc_cli_factory;
  __shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> local_48;
  context *ctx;
  
  std::
  make_shared<nuraft::asio_service,nuraft::asio_service_options_const&,std::shared_ptr<nuraft::logger>&>
            ((asio_service_options *)&scheduler,(shared_ptr<nuraft::logger> *)params_given);
  std::__shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2> *)sm,
             (__shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2> *)&scheduler);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&scheduler.
              super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  asio_service::create_rpc_listener
            ((asio_service *)&scheduler,
             (ushort)(sm->super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,(ptr<logger> *)((ulong)asio_options & 0xffff));
  std::__shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2> *)(sm + 1),
             (__shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2> *)&scheduler);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&scheduler.
              super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (sm[1].super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    (this->asio_svc_).super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->asio_svc_).super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    std::__shared_ptr<nuraft::delayed_task_scheduler,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<nuraft::asio_service,void>
              ((__shared_ptr<nuraft::delayed_task_scheduler,(__gnu_cxx::_Lock_policy)2> *)&scheduler
               ,(__shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2> *)sm);
    std::__shared_ptr<nuraft::rpc_client_factory,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<nuraft::asio_service,void>
              ((__shared_ptr<nuraft::rpc_client_factory,(__gnu_cxx::_Lock_policy)2> *)
               &rpc_cli_factory,(__shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2> *)sm
              );
    this_01 = (context *)operator_new(0xb8);
    nuraft::context::context
              (this_01,(ptr<state_mgr> *)lg,(ptr<state_machine> *)smgr,(ptr<rpc_listener> *)(sm + 1)
               ,(ptr<logger> *)CONCAT44(in_register_00000084,port_number),&rpc_cli_factory,
               &scheduler,(raft_params *)opt);
    ctx = this_01;
    std::make_shared<nuraft::raft_server,nuraft::context*&,nuraft::raft_server::init_options_const&>
              ((context **)&local_48,(init_options *)&ctx);
    this_00 = (__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *)(sm + 2);
    std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::operator=(this_00,&local_48)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    peVar1 = sm[1].super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar1->_vptr_state_machine[2])(peVar1,this_00);
    std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *)this,this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rpc_cli_factory.
                super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&scheduler.
                super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return (int)this;
}

Assistant:

ptr<raft_server> raft_launcher::init(ptr<state_machine> sm,
                                     ptr<state_mgr> smgr,
                                     ptr<logger> lg,
                                     int port_number,
                                     const asio_service::options& asio_options,
                                     const raft_params& params_given,
                                     const raft_server::init_options& opt)
{
    asio_svc_ = cs_new<asio_service>(asio_options, lg);
    asio_listener_ = asio_svc_->create_rpc_listener(port_number, lg);
    if (!asio_listener_) return nullptr;

    ptr<delayed_task_scheduler> scheduler = asio_svc_;
    ptr<rpc_client_factory> rpc_cli_factory = asio_svc_;

    context* ctx = new context( smgr,
                                sm,
                                asio_listener_,
                                lg,
                                rpc_cli_factory,
                                scheduler,
                                params_given );
    raft_instance_ = cs_new<raft_server>(ctx, opt);
    asio_listener_->listen( raft_instance_ );
    return raft_instance_;
}